

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

void __thiscall cmProcess::Finish(cmProcess *this)

{
  long lVar1;
  rep_conflict rVar2;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  rVar2 = (double)(lVar1 - (this->StartTime).__d.__r) / 1000000000.0;
  if (rVar2 <= 0.0) {
    rVar2 = 0.0;
  }
  (this->TotalTime).__r = rVar2;
  cmCTestRunTest::FinalizeTest
            ((this->Runner)._M_t.
             super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
             super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
             super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl,true);
  return;
}

Assistant:

void cmProcess::Finish()
{
  this->TotalTime = std::chrono::steady_clock::now() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= cmDuration::zero()) {
    this->TotalTime = cmDuration::zero();
  }
  this->Runner->FinalizeTest();
}